

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::remove_connection(torrent *this,peer_connection *p)

{
  peer_connection **__src;
  pointer *ppppVar1;
  peer_connection **pppVar2;
  iterator __dest;
  peer_connection *local_10;
  
  local_10 = p;
  __dest = sorted_find<libtorrent::aux::container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,libtorrent::aux::peer_connection_const*>
                     (&(this->super_torrent_hot_members).m_connections,&local_10);
  pppVar2 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != pppVar2) {
    __src = __dest._M_current + 1;
    if (__src != pppVar2) {
      memmove(__dest._M_current,__src,(long)pppVar2 - (long)__src);
    }
    ppppVar1 = &(this->super_torrent_hot_members).m_connections.
                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                .
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppppVar1 = *ppppVar1 + -1;
  }
  return;
}

Assistant:

void torrent::remove_connection(peer_connection const* p)
	{
		TORRENT_ASSERT(m_iterating_connections == 0);
		auto const i = sorted_find(m_connections, p);
		if (i != m_connections.end())
			m_connections.erase(i);
	}